

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float_conversion.cc
# Opt level: O0

Digits __thiscall
absl::lts_20250127::str_format_internal::anon_unknown_0::FractionalDigitGenerator::GetDigits
          (FractionalDigitGenerator *this)

{
  char cVar1;
  char cVar2;
  Digits DVar3;
  FractionalDigitGenerator *this_local;
  Digits digits;
  
  cVar1 = this->next_digit_;
  digits.digit_before_nine = '\0';
  digits._1_7_ = 0;
  cVar2 = GetOneDigit(this);
  this->next_digit_ = cVar2;
  while (this->next_digit_ == '\t') {
    digits._0_8_ = digits._0_8_ + 1;
    cVar2 = GetOneDigit(this);
    this->next_digit_ = cVar2;
  }
  DVar3._1_3_ = (undefined3)(this->next_digit_ >> 7);
  DVar3.digit_before_nine = cVar1;
  DVar3._4_4_ = 0;
  DVar3.num_nines = digits._0_8_;
  return DVar3;
}

Assistant:

Digits GetDigits() {
    Digits digits{next_digit_, 0};

    next_digit_ = GetOneDigit();
    while (next_digit_ == 9) {
      ++digits.num_nines;
      next_digit_ = GetOneDigit();
    }

    return digits;
  }